

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O0

int __thiscall
unodb::detail::
basic_inode_4<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
::remove(basic_inode_4<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
         *this,char *__filename)

{
  bool bVar1;
  int extraout_EAX;
  const_iterator pvVar2;
  const_iterator pvVar3;
  reference pvVar4;
  basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>
  *leaf;
  reference new_value;
  reference this_00;
  reference this_01;
  db_type *in_RDX;
  ulong local_48;
  size_type i;
  undefined1 local_38 [8];
  leaf_reclaimable_ptr r;
  uchar children_count_;
  db_type *db_instance_local;
  uint8_t child_index_local;
  basic_inode_4<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
  *this_local;
  
  r._M_t.
  super___uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  .
  super__Head_base<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_false>
  ._M_head_impl._7_1_ =
       in_critical_section<unsigned_char>::load
                 ((in_critical_section<unsigned_char> *)&this->field_0x20);
  if (r._M_t.
      super___uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      .
      super__Head_base<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_false>
      ._M_head_impl._7_1_ <= (byte)__filename) {
    __assert_fail("child_index < children_count_",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x586,
                  "void unodb::detail::basic_inode_4<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::remove(std::uint8_t, db_type &) [ArtPolicy = unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
                 );
  }
  pvVar2 = std::array<unodb::in_critical_section<std::byte>,_4UL>::cbegin(&(this->keys).byte_array);
  pvVar3 = std::array<unodb::in_critical_section<std::byte>,_4UL>::cbegin(&(this->keys).byte_array);
  bVar1 = std::is_sorted<unodb::in_critical_section<std::byte>const*>
                    (pvVar2,pvVar3 + r._M_t.
                                     super___uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                                     .
                                     super__Head_base<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_false>
                                     ._M_head_impl._7_1_);
  if (!bVar1) {
    __assert_fail("std::is_sorted( keys.byte_array.cbegin(), keys.byte_array.cbegin() + children_count_)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x588,
                  "void unodb::detail::basic_inode_4<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::remove(std::uint8_t, db_type &) [ArtPolicy = unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
                 );
  }
  pvVar4 = std::
           array<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>,_4UL>
           ::operator[](&this->children,(ulong)__filename & 0xff);
  i = (size_type)
      in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>::load
                (pvVar4);
  leaf = basic_node_ptr<unodb::detail::olc_node_header>::
         ptr<unodb::detail::basic_leaf<std::span<std::byte_const,18446744073709551615ul>,unodb::detail::olc_node_header>*>
                   ((basic_node_ptr<unodb::detail::olc_node_header> *)&i);
  basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>
  ::reclaim_leaf_on_scope_exit
            ((basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>
              *)local_38,leaf,in_RDX);
  for (local_48 = (ulong)__filename & 0xff;
      local_48 <
      r._M_t.
      super___uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      .
      super__Head_base<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_false>
      ._M_head_impl._7_1_ - 1; local_48 = local_48 + 1) {
    new_value = std::array<unodb::in_critical_section<std::byte>,_4UL>::operator[]
                          (&(this->keys).byte_array,local_48 + 1);
    this_00 = std::array<unodb::in_critical_section<std::byte>,_4UL>::operator[]
                        (&(this->keys).byte_array,local_48);
    in_critical_section<std::byte>::operator=(this_00,new_value);
    pvVar4 = std::
             array<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>,_4UL>
             ::operator[](&this->children,local_48 + 1);
    this_01 = std::
              array<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>,_4UL>
              ::operator[](&this->children,local_48);
    in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>::operator=
              (this_01,pvVar4);
  }
  r._M_t.
  super___uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  .
  super__Head_base<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_false>
  ._M_head_impl._7_1_ =
       r._M_t.
       super___uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
       .
       super__Head_base<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_false>
       ._M_head_impl._7_1_ - 1;
  in_critical_section<unsigned_char>::operator=
            ((in_critical_section<unsigned_char> *)&this->field_0x20,
             r._M_t.
             super___uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
             .
             super__Head_base<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_false>
             ._M_head_impl._7_1_);
  pvVar2 = std::array<unodb::in_critical_section<std::byte>,_4UL>::cbegin(&(this->keys).byte_array);
  pvVar3 = std::array<unodb::in_critical_section<std::byte>,_4UL>::cbegin(&(this->keys).byte_array);
  bVar1 = std::is_sorted<unodb::in_critical_section<std::byte>const*>
                    (pvVar2,pvVar3 + r._M_t.
                                     super___uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                                     .
                                     super__Head_base<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_false>
                                     ._M_head_impl._7_1_);
  if (!bVar1) {
    __assert_fail("std::is_sorted( keys.byte_array.cbegin(), keys.byte_array.cbegin() + children_count_)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x59a,
                  "void unodb::detail::basic_inode_4<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::remove(std::uint8_t, db_type &) [ArtPolicy = unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
                 );
  }
  std::
  unique_ptr<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ::~unique_ptr((unique_ptr<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::db_leaf_qsbr_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                 *)local_38);
  return extraout_EAX;
}

Assistant:

constexpr void remove(std::uint8_t child_index,
                        db_type &db_instance) noexcept {
    auto children_count_ = this->children_count.load();

    UNODB_DETAIL_ASSERT(child_index < children_count_);
    UNODB_DETAIL_ASSERT(std::is_sorted(
        keys.byte_array.cbegin(), keys.byte_array.cbegin() + children_count_));

    const auto r{ArtPolicy::reclaim_leaf_on_scope_exit(
        children[child_index].load().template ptr<leaf_type *>(), db_instance)};

    typename decltype(keys.byte_array)::size_type i = child_index;
    for (; i < static_cast<unsigned>(children_count_ - 1); ++i) {
      keys.byte_array[i] = keys.byte_array[i + 1];
      children[i] = children[i + 1];
    }
#ifndef UNODB_DETAIL_X86_64
    keys.byte_array[i] = unused_key_byte;
#endif

    --children_count_;
    this->children_count = children_count_;

    UNODB_DETAIL_ASSERT(std::is_sorted(
        keys.byte_array.cbegin(), keys.byte_array.cbegin() + children_count_));
  }